

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSpotLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::SpotLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *pXVar1;
  string *psVar2;
  Vec3fa VVar3;
  SpotLight light;
  Vec3fa I;
  AffineSpace3fa space;
  allocator local_111;
  float local_110;
  float local_10c;
  undefined1 local_108 [80];
  SpotLight local_b8;
  undefined1 local_68 [80];
  
  pXVar1 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"AffineSpace",(allocator *)local_68);
  XML::child((XML *)local_108,(string *)pXVar1);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)(local_68 + 0x10),pXVar1,(Ref<embree::XML> *)local_108);
  if ((XML *)local_108._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_108._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_b8);
  psVar2 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"I",&local_111);
  XML::child((XML *)local_108,psVar2);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)local_68,(Ref<embree::XML> *)psVar2);
  if ((XML *)local_108._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_108._0_8_ + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  psVar2 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"angleMin",&local_111);
  pXVar1 = (XMLLoader *)local_108;
  XML::child((XML *)pXVar1,psVar2);
  local_10c = load<float>(pXVar1,(Ref<embree::XML> *)local_108);
  if ((XML *)local_108._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_108._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_b8);
  psVar2 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"angleMax",&local_111);
  pXVar1 = (XMLLoader *)local_108;
  XML::child((XML *)pXVar1,psVar2);
  local_110 = load<float>(pXVar1,(Ref<embree::XML> *)local_108);
  if ((XML *)local_108._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_108._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8.super_Light.type = LIGHT_SPOT;
  local_b8.P.field_0._0_8_ = 0;
  local_b8.P.field_0._8_8_ = 0;
  local_b8.D.field_0._0_8_ = 0;
  local_b8.D.field_0._8_8_ = 0x3f800000;
  local_b8.I.field_0._0_8_ = local_68._0_8_;
  local_b8.I.field_0._8_8_ = local_68._8_8_;
  local_b8.angleMin = local_10c;
  local_b8.angleMax = local_110;
  this_00 = (LightNodeImpl<embree::SceneGraph::SpotLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::operator_new(0xc0);
  SceneGraph::SpotLight::transform(&local_b8,(AffineSpace3fa *)(local_68 + 0x10));
  SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::LightNodeImpl
            (this_00,(SpotLight *)local_108);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSpotLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3fa>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const Vec3fa D = Vec3fa(0,0,1);
    const float angleMin = load<float>(xml->child("angleMin"));
    const float angleMax = load<float>(xml->child("angleMax"));
    const SceneGraph::SpotLight light = SceneGraph::SpotLight(P,D,I,angleMin,angleMax);
    return new SceneGraph::LightNodeImpl<SceneGraph::SpotLight>(light.transform(space));
  }